

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O3

Expression __thiscall
dynet::expr::detail::f<dynet::AffineTransform,std::initializer_list<dynet::expr::Expression>>
          (detail *this,initializer_list<dynet::expr::Expression> *xs)

{
  uint *puVar1;
  vector<dynet::Node*,std::allocator<dynet::Node*>> *this_00;
  size_type sVar2;
  iterator pEVar3;
  iterator __position;
  Node *pNVar4;
  pointer pVVar5;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar6;
  long lVar7;
  Expression EVar8;
  vector<dynet::VariableIndex,_std::allocator<dynet::VariableIndex>_> xis;
  allocator_type local_3d;
  undefined4 local_3c;
  Node *local_38;
  vector<dynet::VariableIndex,_std::allocator<dynet::VariableIndex>_> local_30;
  
  this_00 = (vector<dynet::Node*,std::allocator<dynet::Node*>> *)xs->_M_array->pg;
  std::vector<dynet::VariableIndex,_std::allocator<dynet::VariableIndex>_>::vector
            (&local_30,xs->_M_len,(allocator_type *)&local_38);
  sVar2 = xs->_M_len;
  if (sVar2 != 0) {
    pEVar3 = xs->_M_array;
    lVar7 = 0;
    pVVar5 = local_30.
             super__Vector_base<dynet::VariableIndex,_std::allocator<dynet::VariableIndex>_>._M_impl
             .super__Vector_impl_data._M_start;
    do {
      puVar1 = (uint *)((long)&(pEVar3->i).t + lVar7);
      lVar7 = lVar7 + 0x10;
      pVVar5->t = *puVar1;
      pVVar5 = pVVar5 + 1;
    } while (sVar2 << 4 != lVar7);
  }
  local_3c = (undefined4)((ulong)(*(long *)(this_00 + 8) - *(long *)this_00) >> 3);
  pNVar4 = (Node *)operator_new(0x60);
  *(code **)pNVar4 = std::streambuf::xsputn;
  std::vector<dynet::VariableIndex,std::allocator<dynet::VariableIndex>>::
  vector<__gnu_cxx::__normal_iterator<dynet::VariableIndex_const*,std::vector<dynet::VariableIndex,std::allocator<dynet::VariableIndex>>>,void>
            ((vector<dynet::VariableIndex,std::allocator<dynet::VariableIndex>> *)(pNVar4 + 8),
             (__normal_iterator<const_dynet::VariableIndex_*,_std::vector<dynet::VariableIndex,_std::allocator<dynet::VariableIndex>_>_>
              )local_30.
               super__Vector_base<dynet::VariableIndex,_std::allocator<dynet::VariableIndex>_>.
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<const_dynet::VariableIndex_*,_std::vector<dynet::VariableIndex,_std::allocator<dynet::VariableIndex>_>_>
              )local_30.
               super__Vector_base<dynet::VariableIndex,_std::allocator<dynet::VariableIndex>_>.
               _M_impl.super__Vector_impl_data._M_finish,&local_3d);
  *(undefined8 *)(pNVar4 + 0x3c) = 0x100000000;
  *(undefined8 *)(pNVar4 + 0x48) = default_device;
  *(code **)pNVar4 =
       boost::archive::text_iarchive_impl<boost::archive::text_iarchive>::text_iarchive_impl;
  __position._M_current = *(Node ***)(this_00 + 8);
  local_38 = pNVar4;
  if (__position._M_current == *(Node ***)(this_00 + 0x10)) {
    std::vector<dynet::Node*,std::allocator<dynet::Node*>>::_M_realloc_insert<dynet::Node*>
              (this_00,__position,&local_38);
  }
  else {
    *__position._M_current = pNVar4;
    *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
  }
  dynet::ComputationGraph::set_dim_for_new_node((VariableIndex *)this_00);
  *(vector<dynet::Node*,std::allocator<dynet::Node*>> **)this = this_00;
  *(undefined4 *)(this + 8) = local_3c;
  uVar6 = extraout_RDX;
  if (local_30.super__Vector_base<dynet::VariableIndex,_std::allocator<dynet::VariableIndex>_>.
      _M_impl.super__Vector_impl_data._M_start != (VariableIndex *)0x0) {
    operator_delete(local_30.
                    super__Vector_base<dynet::VariableIndex,_std::allocator<dynet::VariableIndex>_>.
                    _M_impl.super__Vector_impl_data._M_start);
    uVar6 = extraout_RDX_00;
  }
  EVar8._8_8_ = uVar6;
  EVar8.pg = (ComputationGraph *)this;
  return EVar8;
}

Assistant:

Expression f(const T& xs) {
    ComputationGraph *pg = xs.begin()->pg;
    std::vector<VariableIndex> xis(xs.size());
    int i = 0;
    for (auto xi = xs.begin(); xi != xs.end(); ++xi) xis[i++] = xi->i;
    return Expression(pg, pg->add_function<F>(xis));
  }